

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qclipboard.cpp
# Opt level: O3

void QClipboard::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == changed && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == selectionChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == findBufferChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == dataChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    goto switchD_002bc4ea_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_002bc4ea_default;
  switch(_id) {
  case 0:
    local_1c = *_a[1];
    local_10 = &local_1c;
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_18);
  default:
switchD_002bc4ea_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar3 = 1;
LAB_002bc5d4:
      QMetaObject::activate(_o,&staticMetaObject,iVar3,(void **)0x0);
      return;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar3 = 2;
      goto LAB_002bc5d4;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar3 = 3;
      goto LAB_002bc5d4;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QClipboard::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QClipboard *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->changed((*reinterpret_cast< std::add_pointer_t<QClipboard::Mode>>(_a[1]))); break;
        case 1: _t->selectionChanged(); break;
        case 2: _t->findBufferChanged(); break;
        case 3: _t->dataChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)(QClipboard::Mode )>(_a, &QClipboard::changed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)()>(_a, &QClipboard::selectionChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)()>(_a, &QClipboard::findBufferChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)()>(_a, &QClipboard::dataChanged, 3))
            return;
    }
}